

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  int val;
  xmlXPathObjectPtr val_00;
  xmlXPathObjectPtr value;
  int iStack_30;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      val_00 = valuePop(ctxt);
      if (val_00 != (xmlXPathObjectPtr)0x0) {
        value = val_00;
        if (val_00->type != XPATH_BOOLEAN) {
          ctxt_00 = ctxt->context;
          val = xmlXPathCastToBoolean(val_00);
          value = xmlXPathCacheNewBoolean(ctxt_00,val);
          xmlXPathReleaseObject(ctxt_00,val_00);
        }
        valuePush(ctxt,value);
        return;
      }
      iStack_30 = 10;
    }
    else {
      iStack_30 = 0x17;
    }
  }
  else {
    iStack_30 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_30);
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    cur = xmlXPathCacheConvertBoolean(ctxt->context, cur);
    valuePush(ctxt, cur);
}